

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::CommonCore::processMessage(CommonCore *this,ActionMessage *message)

{
  bool bVar1;
  BasicHandleInfo *M;
  ActionMessage *in_RSI;
  long in_RDI;
  BasicHandleInfo *handle;
  BasicHandleInfo *in_stack_00000038;
  ActionMessage *in_stack_00000040;
  FilterFederate *in_stack_00000048;
  HandleManager *in_stack_ffffffffffffffe0;
  ActionMessage *local_8;
  
  M = HandleManager::getInterfaceHandle
                (in_stack_ffffffffffffffe0,(InterfaceHandle)(BaseType)((ulong)in_RSI >> 0x20),
                 (InterfaceType)((uint)(in_RSI->source_handle).hid >> 0x18));
  local_8 = in_RSI;
  if (M != (BasicHandleInfo *)0x0) {
    clearActionFlag<helics::ActionMessage,helics::MessageFlags>
              (in_RSI,filter_processing_required_flag);
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>
                      ((_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                        *)M,has_source_filter_flag);
    local_8 = in_RSI;
    if ((bVar1) && (*(long *)(in_RDI + 0xae8) != 0)) {
      local_8 = FilterFederate::processMessage
                          (in_stack_00000048,in_stack_00000040,in_stack_00000038);
    }
  }
  return local_8;
}

Assistant:

ActionMessage& CommonCore::processMessage(ActionMessage& message)
{
    auto* handle = loopHandles.getInterfaceHandle(message.source_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return message;
    }
    clearActionFlag(message, filter_processing_required_flag);
    if (checkActionFlag(*handle, has_source_filter_flag)) {
        if (filterFed != nullptr) {
            return filterFed->processMessage(message, handle);
        }
    }

    return message;
}